

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

void __thiscall jbcoin::STPathSet::add(STPathSet *this,Serializer *s)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  reference this_01;
  AccountID *pAVar4;
  Currency *i;
  int iType;
  STPathElement *speElement;
  const_iterator __end2;
  const_iterator __begin2;
  STPath *__range2;
  STPath *spPath;
  const_iterator __end1;
  const_iterator __begin1;
  vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *__range1;
  bool first;
  Serializer *s_local;
  STPathSet *this_local;
  
  bVar1 = SField::isBinary((this->super_STBase).fName);
  if (!bVar1) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STPathSet.cpp"
                  ,0xc1,"virtual void jbcoin::STPathSet::add(Serializer &) const");
  }
  if (((this->super_STBase).fName)->fieldType == STI_PATHSET) {
    bVar1 = true;
    __end1 = std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::begin(&this->value);
    spPath = (STPath *)
             std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::end(&this->value);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
                                  *)&spPath);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
                ::operator*(&__end1);
      if (!bVar1) {
        Serializer::add8(s,0xff);
      }
      __end2 = STPath::begin(this_00);
      speElement = (STPathElement *)STPath::end(this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
                                    *)&speElement);
        if (!bVar1) break;
        this_01 = __gnu_cxx::
                  __normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
                  ::operator*(&__end2);
        uVar3 = STPathElement::getNodeType(this_01);
        Serializer::add8(s,(uchar)uVar3);
        if ((uVar3 & 1) != 0) {
          pAVar4 = STPathElement::getAccountID(this_01);
          Serializer::add160<jbcoin::detail::AccountIDTag>(s,pAVar4);
        }
        if ((uVar3 & 0x10) != 0) {
          i = STPathElement::getCurrency(this_01);
          Serializer::add160<jbcoin::detail::CurrencyTag>(s,i);
        }
        if ((uVar3 & 0x20) != 0) {
          pAVar4 = STPathElement::getIssuerID(this_01);
          Serializer::add160<jbcoin::detail::AccountIDTag>(s,pAVar4);
        }
        __gnu_cxx::
        __normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
        ::operator++(&__end2);
      }
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<const_jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
      ::operator++(&__end1);
    }
    Serializer::add8(s,'\0');
    return;
  }
  __assert_fail("fName->fieldType == STI_PATHSET",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STPathSet.cpp"
                ,0xc2,"virtual void jbcoin::STPathSet::add(Serializer &) const");
}

Assistant:

void
STPathSet::add (Serializer& s) const
{
    assert (fName->isBinary ());
    assert (fName->fieldType == STI_PATHSET);
    bool first = true;

    for (auto const& spPath : value)
    {
        if (!first)
            s.add8 (STPathElement::typeBoundary);

        for (auto const& speElement : spPath)
        {
            int iType = speElement.getNodeType ();

            s.add8 (iType);

            if (iType & STPathElement::typeAccount)
                s.add160 (speElement.getAccountID ());

            if (iType & STPathElement::typeCurrency)
                s.add160 (speElement.getCurrency ());

            if (iType & STPathElement::typeIssuer)
                s.add160 (speElement.getIssuerID ());
        }

        first = false;
    }

    s.add8 (STPathElement::typeNone);
}